

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O3

void __thiscall
Diligent::FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
          (FixedBlockMemoryAllocator *this,IMemoryAllocator *RawMemoryAllocator,size_t BlockSize,
          Uint32 NumBlocksInPage)

{
  ulong uVar1;
  
  (this->super_IMemoryAllocator)._vptr_IMemoryAllocator = (_func_int **)&PTR_Allocate_00930718;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_Allocator = RawMemoryAllocator;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpDescription = "Allocator for vector<MemoryPage>";
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
  ;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpLineNumber = 0xb0;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PagePool).
  super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_AvailablePages)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_Allocator = RawMemoryAllocator;
  (this->m_AvailablePages)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpDescription = "Allocator for unordered_set<size_t>";
  (this->m_AvailablePages)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
  ;
  (this->m_AvailablePages)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpLineNumber = 0xb1;
  (this->m_AvailablePages)._M_h._M_buckets = &(this->m_AvailablePages)._M_h._M_single_bucket;
  (this->m_AvailablePages)._M_h._M_bucket_count = 1;
  (this->m_AvailablePages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_AvailablePages)._M_h._M_element_count = 0;
  (this->m_AvailablePages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_AvailablePages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_AvailablePages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_AddrToPageId)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_Allocator = RawMemoryAllocator;
  (this->m_AddrToPageId)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpDescription = "Allocator for unordered_map<void*, size_t>";
  (this->m_AddrToPageId)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
  ;
  (this->m_AddrToPageId)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<void_*const,_unsigned_long>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpLineNumber = 0xb2;
  (this->m_AddrToPageId)._M_h._M_buckets = &(this->m_AddrToPageId)._M_h._M_single_bucket;
  (this->m_AddrToPageId)._M_h._M_bucket_count = 1;
  (this->m_AddrToPageId)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_AddrToPageId)._M_h._M_element_count = 0;
  (this->m_AddrToPageId)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_AddrToPageId)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_AddrToPageId)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_RawMemoryAllocator = RawMemoryAllocator;
  uVar1 = BlockSize + 7 & 0xfffffffffffffff8;
  this->m_BlockSize = uVar1;
  this->m_NumBlocksInPage = NumBlocksInPage;
  if (uVar1 != 0) {
    CreateNewPage(this);
  }
  return;
}

Assistant:

FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(IMemoryAllocator& RawMemoryAllocator,
                                                     size_t            BlockSize,
                                                     Uint32            NumBlocksInPage) :
    // clang-format off
    m_PagePool          (STD_ALLOCATOR_RAW_MEM(MemoryPage, RawMemoryAllocator, "Allocator for vector<MemoryPage>")),
    m_AvailablePages    (STD_ALLOCATOR_RAW_MEM(size_t, RawMemoryAllocator, "Allocator for unordered_set<size_t>") ),
    m_AddrToPageId      (STD_ALLOCATOR_RAW_MEM(AddrToPageIdMapElem, RawMemoryAllocator, "Allocator for unordered_map<void*, size_t>")),
    m_RawMemoryAllocator{RawMemoryAllocator        },
    m_BlockSize         {AdjustBlockSize(BlockSize)},
    m_NumBlocksInPage   {NumBlocksInPage           }
// clang-format on
{
    // Allocate one page
    if (m_BlockSize > 0)
    {
        CreateNewPage();
    }
}